

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gb.c
# Opt level: O3

void gb_update_wave_channel(gb_sound_t *gb,SOUND *snd,UINT32 cycles)

{
  int iVar1;
  UINT8 UVar2;
  int iVar3;
  byte bVar4;
  char cVar5;
  INT8 IVar6;
  ushort uVar7;
  uint uVar8;
  
  if (snd->on == true) {
    iVar3 = snd->cycles_left;
    iVar1 = iVar3 + cycles;
    snd->cycles_left = iVar1;
    if (1 < iVar1) {
      UVar2 = gb->gbMode;
      uVar7 = snd->frequency_counter;
      uVar8 = iVar3 + cycles + 2;
      do {
        uVar7 = uVar7 + 1 & 0x7ff;
        snd->cycles_left = uVar8 - 4;
        snd->frequency_counter = uVar7;
        snd->sample_reading = false;
        if (UVar2 == '\0') {
          if (uVar7 == 0) {
            snd->sample_reading = true;
            bVar4 = snd->offset;
            goto LAB_0015c1fa;
          }
          if (uVar7 == 0x7ff) {
            snd->offset = snd->offset + 1 & 0x1f;
            uVar7 = 0x7ff;
          }
        }
        else if (uVar7 == 0) {
          snd->sample_reading = true;
          bVar4 = snd->offset;
          if (UVar2 == '\x01') {
            bVar4 = bVar4 + 1 & 0x1f;
            snd->offset = bVar4;
          }
LAB_0015c1fa:
          cVar5 = ((char)gb->snd_regs[(ulong)(bVar4 >> 1) + 0x20] >> ((~bVar4 & 1) << 2) & 0xfU) - 8
          ;
          snd->current_sample = cVar5;
          if (gb->BoostWaveChn != '\0') {
            cVar5 = cVar5 * '\x02';
            snd->current_sample = cVar5;
          }
          if (snd->level == '\0') {
            IVar6 = '\0';
          }
          else {
            IVar6 = (INT8)((int)cVar5 / (1 << (snd->level - 1 & 0x1f)));
          }
          snd->signal = IVar6;
          uVar7 = snd->frequency;
          snd->frequency_counter = uVar7;
        }
        uVar8 = uVar8 - 2;
      } while (3 < uVar8);
    }
  }
  return;
}

Assistant:

static void gb_update_wave_channel(gb_sound_t *gb, struct SOUND *snd, UINT32 cycles)
{
	if (snd->on)
	{
		// compensate for leftover cycles
		snd->cycles_left += cycles;

		while (snd->cycles_left >= 2)
		{
			snd->cycles_left -= 2;

			// Calculate next state
			snd->frequency_counter = (snd->frequency_counter + 1) & 0x7ff;
			snd->sample_reading = false;
			if (gb->gbMode == GBMODE_DMG && snd->frequency_counter == 0x7ff)
				snd->offset = (snd->offset + 1) & 0x1F;
			if (snd->frequency_counter == 0)
			{
				// Read next sample
				snd->sample_reading = true;
				if (gb->gbMode == GBMODE_CGB04)
					snd->offset = (snd->offset + 1) & 0x1f;
				snd->current_sample = gb->snd_regs[AUD3W0 + (snd->offset/2)];
				if (!(snd->offset & 0x01))
				{
					snd->current_sample >>= 4;
				}
				snd->current_sample = (snd->current_sample & 0x0f) - 8;
				if (gb->BoostWaveChn)
					snd->current_sample <<= 1;

				snd->signal = snd->level ? snd->current_sample / (1 << (snd->level - 1)) : 0;

				// Reload frequency counter
				snd->frequency_counter = snd->frequency;
			}
		}
	}
}